

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O3

int main(void)

{
  uint8_t *puVar1;
  undefined4 uVar2;
  tommy_hashlin_node **pptVar3;
  _Bool _Var4;
  _Bool _Var5;
  rtr_socket *socket;
  rtr_socket *__ptr;
  undefined8 *__ptr_00;
  long lVar6;
  spki_record *psVar7;
  rtr_socket *prVar8;
  spki_record *psVar9;
  spki_record *record_00;
  spki_record *record_01;
  int iVar10;
  int i_1;
  int iVar11;
  spki_table *spki_table;
  spki_record *record;
  int i;
  uint uVar12;
  int j;
  long lVar13;
  int j_1;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint result_len;
  spki_table table;
  uint8_t ski [20];
  spki_record *result;
  uint in_stack_ffffffffffceebd0;
  tommy_hashlin_node **in_stack_ffffffffffceebd8;
  spki_table local_4028 [43];
  spki_record *local_1a8 [46];
  undefined8 local_38;
  
  local_38 = *(undefined8 *)(in_FS_OFFSET + 0x28);
  socket = (rtr_socket *)malloc(0x80);
  __ptr = (rtr_socket *)malloc(0x80);
  __ptr_00 = (undefined8 *)calloc(1,0x80);
  auVar21 = _DAT_00109020;
  lVar6 = 0;
  auVar20 = _DAT_00109010;
  do {
    auVar19 = auVar20 ^ auVar21;
    if (auVar19._4_4_ == -0x80000000 && auVar19._0_4_ < -0x7ffffffb) {
      *(int *)((long)__ptr_00 + lVar6 * 4) = (int)lVar6;
      *(int *)((long)__ptr_00 + lVar6 * 4 + 4) = (int)lVar6 + 1;
    }
    lVar6 = lVar6 + 2;
    lVar13 = auVar20._8_8_;
    auVar20._0_8_ = auVar20._0_8_ + 2;
    auVar20._8_8_ = lVar13 + 2;
  } while (lVar6 != 6);
  lVar6 = 0;
  auVar19 = _DAT_00109010;
  do {
    auVar20 = auVar19 ^ auVar21;
    if (auVar20._4_4_ == -0x80000000 && auVar20._0_4_ < -0x7fffffea) {
      *(int *)((long)__ptr_00 + lVar6 * 4 + 0x18) = (int)lVar6;
      *(int *)((long)__ptr_00 + lVar6 * 4 + 0x1c) = (int)lVar6 + 1;
    }
    lVar6 = lVar6 + 2;
    lVar13 = auVar19._8_8_;
    auVar19._0_8_ = auVar19._0_8_ + 2;
    auVar19._8_8_ = lVar13 + 2;
  } while (lVar6 != 0x16);
  uVar12 = 0;
  spki_table_init((spki_table *)&stack0xffffffffffceebd8,(spki_update_fp)0x0);
  local_4028[0].hashtable.bucket[2]._0_4_ = *(undefined4 *)(__ptr_00 + 2);
  local_4028[0].hashtable.bucket[0] = (tommy_hashlin_node **)*__ptr_00;
  local_4028[0].hashtable.bucket[1] = (tommy_hashlin_node **)__ptr_00[1];
  free(__ptr_00);
  iVar11 = 1;
  do {
    psVar7 = (spki_record *)calloc(1,0x80);
    psVar7->asn = 1;
    auVar21 = _DAT_00109020;
    lVar6 = 0;
    auVar20 = _DAT_00109010;
    if ((uVar12 & 1) == 0) {
      do {
        if (SUB164(auVar20 ^ auVar21,4) == -0x80000000 && SUB164(auVar20 ^ auVar21,0) < -0x7ffffffb)
        {
          *(int *)(psVar7->ski + lVar6 * 4) = (int)lVar6;
          *(int *)(psVar7->ski + lVar6 * 4 + 4) = (int)lVar6 + 1;
        }
        lVar6 = lVar6 + 2;
        auVar14._0_8_ = auVar20._0_8_ + 2;
        auVar14._8_8_ = auVar20._8_8_ + 2;
        auVar20 = auVar14;
      } while (lVar6 != 6);
      lVar6 = 0x1c;
      auVar15 = _DAT_00109010;
      iVar10 = iVar11;
      do {
        if (SUB164(auVar15 ^ auVar21,4) == -0x80000000 && SUB164(auVar15 ^ auVar21,0) < -0x7fffffea)
        {
          *(int *)(psVar7->ski + lVar6 + -4) = iVar10 + -1;
          *(int *)(psVar7->ski + lVar6) = iVar10;
        }
        lVar13 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar13 + 2;
        lVar6 = lVar6 + 8;
        iVar10 = iVar10 + 2;
        prVar8 = __ptr;
      } while (lVar6 != 0x74);
    }
    else {
      do {
        if (SUB164(auVar20 ^ auVar21,4) == -0x80000000 && SUB164(auVar20 ^ auVar21,0) < -0x7ffffffb)
        {
          *(int *)(psVar7->ski + lVar6 * 4) = (int)lVar6;
          *(int *)(psVar7->ski + lVar6 * 4 + 4) = (int)lVar6 + 1;
        }
        lVar6 = lVar6 + 2;
        auVar16._0_8_ = auVar20._0_8_ + 2;
        auVar16._8_8_ = auVar20._8_8_ + 2;
        auVar20 = auVar16;
      } while (lVar6 != 6);
      lVar6 = 0x1c;
      auVar17 = _DAT_00109010;
      iVar10 = iVar11;
      do {
        if (SUB164(auVar17 ^ auVar21,4) == -0x80000000 && SUB164(auVar17 ^ auVar21,0) < -0x7fffffea)
        {
          *(int *)(psVar7->ski + lVar6 + -4) = iVar10 + -1;
          *(int *)(psVar7->ski + lVar6) = iVar10;
        }
        lVar13 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 2;
        auVar17._8_8_ = lVar13 + 2;
        lVar6 = lVar6 + 8;
        iVar10 = iVar10 + 2;
        prVar8 = socket;
      } while (lVar6 != 0x74);
    }
    psVar7->socket = prVar8;
    _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar7);
    free(psVar7);
    uVar12 = uVar12 + 1;
    iVar11 = iVar11 + 1;
  } while (uVar12 != 0xff);
  spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,1,(uint8_t *)local_4028,local_1a8,
                     (uint *)&stack0xffffffffffceebd0);
  if ((ulong)in_stack_ffffffffffceebd0 != 0) {
    if (local_1a8[0]->asn != 1) {
      __assert_fail("result->asn == asn",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x93,"void test_ht_1(void)");
    }
    lVar6 = 0;
    do {
      puVar1 = local_1a8[0]->ski + lVar6;
      uVar2 = *(undefined4 *)(local_1a8[0]->ski + lVar6 + 0x10);
      auVar21[0] = -(*puVar1 == (uint8_t)local_4028[0].hashtable.bucket[0]);
      auVar21[1] = -(puVar1[1] == local_4028[0].hashtable.bucket[0]._1_1_);
      auVar21[2] = -(puVar1[2] == local_4028[0].hashtable.bucket[0]._2_1_);
      auVar21[3] = -(puVar1[3] == local_4028[0].hashtable.bucket[0]._3_1_);
      auVar21[4] = -(puVar1[4] == local_4028[0].hashtable.bucket[0]._4_1_);
      auVar21[5] = -(puVar1[5] == local_4028[0].hashtable.bucket[0]._5_1_);
      auVar21[6] = -(puVar1[6] == local_4028[0].hashtable.bucket[0]._6_1_);
      auVar21[7] = -(puVar1[7] == local_4028[0].hashtable.bucket[0]._7_1_);
      auVar21[8] = -(puVar1[8] == (uint8_t)local_4028[0].hashtable.bucket[1]);
      auVar21[9] = -(puVar1[9] == local_4028[0].hashtable.bucket[1]._1_1_);
      auVar21[10] = -(puVar1[10] == local_4028[0].hashtable.bucket[1]._2_1_);
      auVar21[0xb] = -(puVar1[0xb] == local_4028[0].hashtable.bucket[1]._3_1_);
      auVar21[0xc] = -(puVar1[0xc] == local_4028[0].hashtable.bucket[1]._4_1_);
      auVar21[0xd] = -(puVar1[0xd] == local_4028[0].hashtable.bucket[1]._5_1_);
      auVar21[0xe] = -(puVar1[0xe] == local_4028[0].hashtable.bucket[1]._6_1_);
      auVar21[0xf] = -(puVar1[0xf] == local_4028[0].hashtable.bucket[1]._7_1_);
      auVar22[0] = -((char)uVar2 == (char)local_4028[0].hashtable.bucket[2]._0_4_);
      auVar22[1] = -((char)((uint)uVar2 >> 8) ==
                    (char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 8));
      auVar22[2] = -((char)((uint)uVar2 >> 0x10) ==
                    (char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 0x10));
      auVar22[3] = -((char)((uint)uVar2 >> 0x18) ==
                    (char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 0x18));
      auVar22[4] = 0xff;
      auVar22[5] = 0xff;
      auVar22[6] = 0xff;
      auVar22[7] = 0xff;
      auVar22[8] = 0xff;
      auVar22[9] = 0xff;
      auVar22[10] = 0xff;
      auVar22[0xb] = 0xff;
      auVar22[0xc] = 0xff;
      auVar22[0xd] = 0xff;
      auVar22[0xe] = 0xff;
      auVar22[0xf] = 0xff;
      auVar21 = auVar21 & auVar22;
      if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff) {
        __assert_fail("memcmp(&result[i].ski, ski, SKI_SIZE) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x94,"void test_ht_1(void)");
      }
      lVar6 = lVar6 + 0x80;
    } while ((ulong)in_stack_ffffffffffceebd0 << 7 != lVar6);
    if (in_stack_ffffffffffceebd0 == 0xff) {
      free(local_1a8[0]);
      spki_table_src_remove((spki_table *)&stack0xffffffffffceebd8,socket);
      spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,1,(uint8_t *)local_4028,local_1a8,
                         (uint *)&stack0xffffffffffceebd0);
      lVar6 = 0xff;
      psVar7 = local_1a8[0];
      do {
        if (psVar7->asn != 1) {
          __assert_fail("result[i].asn == asn",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                        ,0x9f,"void test_ht_1(void)");
        }
        uVar2 = *(undefined4 *)(psVar7->ski + 0x10);
        auVar18[0] = -(psVar7->ski[0] == (uint8_t)local_4028[0].hashtable.bucket[0]);
        auVar18[1] = -(psVar7->ski[1] == local_4028[0].hashtable.bucket[0]._1_1_);
        auVar18[2] = -(psVar7->ski[2] == local_4028[0].hashtable.bucket[0]._2_1_);
        auVar18[3] = -(psVar7->ski[3] == local_4028[0].hashtable.bucket[0]._3_1_);
        auVar18[4] = -(psVar7->ski[4] == local_4028[0].hashtable.bucket[0]._4_1_);
        auVar18[5] = -(psVar7->ski[5] == local_4028[0].hashtable.bucket[0]._5_1_);
        auVar18[6] = -(psVar7->ski[6] == local_4028[0].hashtable.bucket[0]._6_1_);
        auVar18[7] = -(psVar7->ski[7] == local_4028[0].hashtable.bucket[0]._7_1_);
        auVar18[8] = -(psVar7->ski[8] == (uint8_t)local_4028[0].hashtable.bucket[1]);
        auVar18[9] = -(psVar7->ski[9] == local_4028[0].hashtable.bucket[1]._1_1_);
        auVar18[10] = -(psVar7->ski[10] == local_4028[0].hashtable.bucket[1]._2_1_);
        auVar18[0xb] = -(psVar7->ski[0xb] == local_4028[0].hashtable.bucket[1]._3_1_);
        auVar18[0xc] = -(psVar7->ski[0xc] == local_4028[0].hashtable.bucket[1]._4_1_);
        auVar18[0xd] = -(psVar7->ski[0xd] == local_4028[0].hashtable.bucket[1]._5_1_);
        auVar18[0xe] = -(psVar7->ski[0xe] == local_4028[0].hashtable.bucket[1]._6_1_);
        auVar18[0xf] = -(psVar7->ski[0xf] == local_4028[0].hashtable.bucket[1]._7_1_);
        auVar23[0] = -((char)local_4028[0].hashtable.bucket[2]._0_4_ == (char)uVar2);
        auVar23[1] = -((char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 8) ==
                      (char)((uint)uVar2 >> 8));
        auVar23[2] = -((char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 0x10) ==
                      (char)((uint)uVar2 >> 0x10));
        auVar23[3] = -((char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 0x18) ==
                      (char)((uint)uVar2 >> 0x18));
        auVar23[4] = 0xff;
        auVar23[5] = 0xff;
        auVar23[6] = 0xff;
        auVar23[7] = 0xff;
        auVar23[8] = 0xff;
        auVar23[9] = 0xff;
        auVar23[10] = 0xff;
        auVar23[0xb] = 0xff;
        auVar23[0xc] = 0xff;
        auVar23[0xd] = 0xff;
        auVar23[0xe] = 0xff;
        auVar23[0xf] = 0xff;
        auVar18 = auVar18 & auVar23;
        if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) {
          __assert_fail("memcmp(&result[i].ski, ski, SKI_SIZE) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                        ,0xa0,"void test_ht_1(void)");
        }
        if (psVar7->socket != __ptr) {
          __assert_fail("result[i].socket == socket_two",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                        ,0xa1,"void test_ht_1(void)");
        }
        psVar7 = psVar7 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      spki_table_free((spki_table *)&stack0xffffffffffceebd8);
      free(local_1a8[0]);
      free(socket);
      free(__ptr);
      printf("%s() complete\n","test_ht_1");
      psVar7 = create_record(10,0x14,0x1e,(rtr_socket *)0x0);
      psVar9 = create_record(10,0x14,0x28,(rtr_socket *)0x0);
      spki_table_init((spki_table *)&stack0xffffffffffceebd8,(spki_update_fp)0x0);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar7);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar9);
      spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,10,psVar7->ski,
                         (spki_record **)local_4028,(uint *)local_1a8);
      pptVar3 = local_4028[0].hashtable.bucket[0];
      if ((int)local_1a8[0] != 2) {
        __assert_fail("result_len == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xbe,"void test_ht_2(void)");
      }
      _Var4 = spki_records_are_equal((spki_record *)local_4028[0].hashtable.bucket[0],psVar7);
      _Var5 = spki_records_are_equal((spki_record *)pptVar3,psVar9);
      if (_Var4 == _Var5) {
        __assert_fail("spki_records_are_equal(&result[0], record1) != spki_records_are_equal(&result[0], record2)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xc1,"void test_ht_2(void)");
      }
      _Var4 = spki_records_are_equal((spki_record *)((long)pptVar3 + 0x80),psVar7);
      _Var5 = spki_records_are_equal((spki_record *)((long)pptVar3 + 0x80),psVar9);
      if (_Var4 == _Var5) {
        __assert_fail("spki_records_are_equal(&result[1], record1) != spki_records_are_equal(&result[1], record2)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xc2,"void test_ht_2(void)");
      }
      free(pptVar3);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,psVar7);
      spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,10,psVar7->ski,
                         (spki_record **)local_4028,(uint *)local_1a8);
      pptVar3 = local_4028[0].hashtable.bucket[0];
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,200,"void test_ht_2(void)");
      }
      _Var4 = spki_records_are_equal((spki_record *)local_4028[0].hashtable.bucket[0],psVar9);
      if (!_Var4) {
        __assert_fail("spki_records_are_equal(&result[0], record2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xc9,"void test_ht_2(void)");
      }
      free(pptVar3);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,psVar9);
      spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,10,psVar7->ski,
                         (spki_record **)local_4028,(uint *)local_1a8);
      if ((int)local_1a8[0] != 0) {
        __assert_fail("result_len == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xcf,"void test_ht_2(void)");
      }
      if ((spki_record *)local_4028[0].hashtable.bucket[0] != (spki_record *)0x0) {
        __assert_fail("!result",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xd0,"void test_ht_2(void)");
      }
      spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,10,psVar9->ski,
                         (spki_record **)local_4028,(uint *)local_1a8);
      if ((int)local_1a8[0] != 0) {
        __assert_fail("result_len == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xd2,"void test_ht_2(void)");
      }
      if ((spki_record *)local_4028[0].hashtable.bucket[0] != (spki_record *)0x0) {
        __assert_fail("!result",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xd3,"void test_ht_2(void)");
      }
      free(psVar7);
      free(psVar9);
      spki_table_free((spki_table *)&stack0xffffffffffceebd8);
      printf("%s() complete\n","test_ht_2");
      psVar7 = create_record(10,10,10,(rtr_socket *)0x0);
      psVar9 = create_record(10,10,0xb,(rtr_socket *)0x0);
      record_00 = create_record(10,0xb,10,(rtr_socket *)0x0);
      record_01 = create_record(0xb,10,10,(rtr_socket *)0x0);
      spki_table_init((spki_table *)&stack0xffffffffffceebd8,(spki_update_fp)0x0);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar7);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar9);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,record_00);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,record_01);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,psVar7);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar9->asn,psVar9->ski,
                                  (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xf8,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xf9,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_00->asn,
                                  record_00->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xfc,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xfd,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_01->asn,
                                  record_01->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x100,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x101,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar7);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,psVar9);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar7->asn,psVar7->ski,
                                  (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x109,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x10a,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_00->asn,
                                  record_00->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x10d,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x10e,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_01->asn,
                                  record_01->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x111,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x112,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar9);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,record_00);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar7->asn,psVar7->ski,
                                  (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x11a,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 2) {
        __assert_fail("result_len == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x11b,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar9->asn,psVar9->ski,
                                  (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x11e,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 2) {
        __assert_fail("result_len == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x11f,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_01->asn,
                                  record_01->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x122,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x123,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,record_00);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,record_01);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar7->asn,psVar7->ski,
                                  (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,299,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 2) {
        __assert_fail("result_len == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,300,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar9->asn,psVar9->ski,
                                  (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x12f,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 2) {
        __assert_fail("result_len == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x130,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar11 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_00->asn,
                                  record_00->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x133,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x134,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      spki_table = (spki_table *)&stack0xffffffffffceebd8;
      spki_table_free(spki_table);
      free(psVar7);
      free(psVar9);
      free(record_00);
      free(record_01);
      lVar6 = 0;
      printf("%s complete\n");
      spki_table_init(local_4028,(spki_update_fp)0x0);
      do {
        lVar13 = 0;
        do {
          psVar7 = create_record((int)lVar6,(int)lVar13,(int)lVar13,(rtr_socket *)0x0);
          (spki_table->hashtable).bucket[lVar13] = (tommy_hashlin_node **)psVar7;
          _spki_table_add_assert(local_4028,psVar7);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x32);
        lVar6 = lVar6 + 1;
        spki_table = (spki_table *)(spki_table[1].hashtable.bucket + 4);
      } while (lVar6 != 0x32);
      iVar11 = spki_table_get_all(local_4028,*(uint32_t *)((long)in_stack_ffffffffffceebd8 + 0x14),
                                  (uint8_t *)in_stack_ffffffffffceebd8,local_1a8,
                                  (uint *)&stack0xffffffffffceebd0);
      if (iVar11 != 0) {
        __assert_fail("spki_table_get_all(&table, records[i][j]->asn, records[i][j]->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x159,"void test_ht_4(void)");
      }
      __assert_fail("result_len == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x15a,"void test_ht_4(void)");
    }
  }
  __assert_fail("count == 255",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                ,0x97,"void test_ht_1(void)");
}

Assistant:

int main(void)
{
	test_ht_1();
	test_ht_2();
	test_ht_3();
	test_ht_4();
	test_ht_5();
	test_ht_6();
	test_ht_7();
	test_table_swap();
	test_table_diff();
	return EXIT_SUCCESS;
}